

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_des.cc
# Opt level: O3

int des_ede_init_key(EVP_CIPHER_CTX *ctx,uint8_t *key,uint8_t *iv,int enc)

{
  DES_key_schedule *schedule;
  
  schedule = (DES_key_schedule *)ctx->cipher_data;
  DES_set_key_ex(key,schedule);
  DES_set_key_ex(key + 8,schedule + 1);
  DES_set_key_ex(key,schedule + 2);
  return 1;
}

Assistant:

static int des_ede_init_key(EVP_CIPHER_CTX *ctx, const uint8_t *key,
                            const uint8_t *iv, int enc) {
  DES_EDE_KEY *dat = (DES_EDE_KEY *)ctx->cipher_data;
  // 2-DES is 3-DES with the first key used twice.
  DES_set_key_ex(key, &dat->ks.ks[0]);
  DES_set_key_ex(key + 8, &dat->ks.ks[1]);
  DES_set_key_ex(key, &dat->ks.ks[2]);
  return 1;
}